

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * libtorrent::extension(string *__return_storage_ptr__,string *f)

{
  char cVar1;
  ulong uVar2;
  allocator<char> local_9;
  
  uVar2 = (ulong)(uint)f->_M_string_length;
  while ((0 < (int)uVar2 && (cVar1 = (f->_M_dataplus)._M_p[uVar2 - 1], cVar1 != '/'))) {
    uVar2 = uVar2 - 1;
    if (cVar1 == '.') {
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)f);
      return __return_storage_ptr__;
    }
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string extension(std::string const& f)
	{
		for (int i = int(f.size()) - 1; i >= 0; --i)
		{
			auto const idx = static_cast<std::size_t>(i);
			if (f[idx] == '/') break;
#ifdef TORRENT_WINDOWS
			if (f[idx] == '\\') break;
#endif
			if (f[idx] != '.') continue;
			return f.substr(idx);
		}
		return "";
	}